

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
wave::File::Read(vector<float,_std::allocator<float>_> *__return_storage_ptr__,File *this,
                uint64_t frame_number,error_code *err)

{
  Error err_00;
  error_code eVar1;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  err_00 = Read(this,frame_number,internal::NoDecrypt,__return_storage_ptr__);
  eVar1 = make_error_code(err_00);
  err->_M_value = eVar1._M_value;
  err->_M_cat = eVar1._M_cat;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> File::Read(uint64_t frame_number, std::error_code& err) {
  std::vector<float> output;
  auto wave_error = Read(frame_number, &output);
  err = make_error_code(wave_error);
  return output;
}